

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clogger.h
# Opt level: O1

void __thiscall
CLogger::Info<char*&,char*&>(CLogger *this,string_view fmt,char **args,char **args_1)

{
  source_loc loc;
  string_view_t fmt_00;
  logger *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  fmt_00.data_ = fmt._M_str;
  spdlog::get((spdlog *)&local_58,"rs");
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt_00.size_ = fmt._M_len;
  spdlog::logger::log_<char*&,char*&>(local_58,loc,info,fmt_00,args,args_1);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void Info(std::string_view fmt, Args &&...args)
	{
		spdlog::get("rs")->info(fmt, std::forward<Args>(args)...);
	}